

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int propagateConstantExprRewrite(Walker *pWalker,Expr *pExpr)

{
  uint uVar1;
  WhereConst *pWVar2;
  Expr **ppEVar3;
  Expr *pEVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  iVar6 = 0;
  if ((pExpr->op == 0x9e) && (uVar1 = pExpr->flags, (uVar1 & 8) == 0)) {
    pWVar2 = (pWalker->u).pConst;
    uVar5 = 0;
    uVar7 = (ulong)(uint)pWVar2->nConst;
    if (pWVar2->nConst < 1) {
      uVar7 = uVar5;
    }
    iVar6 = 1;
    for (; uVar7 * 0x10 != uVar5; uVar5 = uVar5 + 0x10) {
      ppEVar3 = pWVar2->apExpr;
      pEVar4 = *(Expr **)((long)ppEVar3 + uVar5);
      if (((pEVar4 != pExpr) && (pEVar4->iTable == pExpr->iTable)) &&
         (pEVar4->iColumn == pExpr->iColumn)) {
        pWVar2->nChng = pWVar2->nChng + 1;
        pExpr->flags = uVar1 & 0xff7ffff7 | 8;
        pEVar4 = sqlite3ExprDup(pWVar2->pParse->db,*(Expr **)((long)ppEVar3 + uVar5 + 8),0);
        pExpr->pLeft = pEVar4;
        return 1;
      }
    }
  }
  return iVar6;
}

Assistant:

static int propagateConstantExprRewrite(Walker *pWalker, Expr *pExpr){
  int i;
  WhereConst *pConst;
  if( pExpr->op!=TK_COLUMN ) return WRC_Continue;
  if( ExprHasProperty(pExpr, EP_FixedCol) ) return WRC_Continue;
  pConst = pWalker->u.pConst;
  for(i=0; i<pConst->nConst; i++){
    Expr *pColumn = pConst->apExpr[i*2];
    if( pColumn==pExpr ) continue;
    if( pColumn->iTable!=pExpr->iTable ) continue;
    if( pColumn->iColumn!=pExpr->iColumn ) continue;
    /* A match is found.  Add the EP_FixedCol property */
    pConst->nChng++;
    ExprClearProperty(pExpr, EP_Leaf);
    ExprSetProperty(pExpr, EP_FixedCol);
    assert( pExpr->pLeft==0 );
    pExpr->pLeft = sqlite3ExprDup(pConst->pParse->db, pConst->apExpr[i*2+1], 0);
    break;
  }
  return WRC_Prune;
}